

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O1

int CBS_get_any_asn1(CBS *cbs,CBS *out,CBS_ASN1_TAG *out_tag)

{
  int iVar1;
  int iVar2;
  size_t header_len;
  ulong local_18;
  
  iVar2 = 0;
  iVar1 = cbs_get_any_asn1_element(cbs,out,out_tag,&local_18,(int *)0x0,(int *)0x0,0);
  if ((iVar1 != 0) && (iVar2 = 1, out != (CBS *)0x0)) {
    if (out->len < local_18) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbs.cc"
                    ,0x19e,"int CBS_get_any_asn1(CBS *, CBS *, CBS_ASN1_TAG *)");
    }
    out->data = out->data + local_18;
    out->len = out->len - local_18;
  }
  return iVar2;
}

Assistant:

int CBS_get_any_asn1(CBS *cbs, CBS *out, CBS_ASN1_TAG *out_tag) {
  size_t header_len;
  if (!CBS_get_any_asn1_element(cbs, out, out_tag, &header_len)) {
    return 0;
  }

  if (out && !CBS_skip(out, header_len)) {
    assert(0);
    return 0;
  }

  return 1;
}